

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::rl_l(CPU *this)

{
  CPU *this_local;
  
  rl_r8(this,&this->regs->l);
  return 2;
}

Assistant:

int CPU::rl_l() {
    rl_r8(regs.l);
    return 2;
}